

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex>::TestBody
          (CheckedRecursiveMutexTest_InvalidUnlock2_Test<yamc::checked::recursive_mutex> *this)

{
  bool *pbVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  StringLike<const_char_*> *regex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  DeathTest *gtest_dt;
  TypeParam mtx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8 [2];
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_e8;
  undefined8 uStack_d0;
  AssertHelper local_c8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  recursive_mutex_base local_90;
  
  yamc::checked::recursive_mutex::recursive_mutex((recursive_mutex *)&local_90);
  pbVar1 = &local_e8.impl_.full_match_;
  local_e8.impl_.full_match_ = false;
  local_e8.impl_._17_7_ = 0;
  uStack_d0 = 0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::recursive_mutex_base::lock(&local_90);
  }
  if (local_e8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_e8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  local_e8.impl_.full_match_ = false;
  local_e8.impl_._17_7_ = 0;
  uStack_d0 = 0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::recursive_mutex_base::lock(&local_90);
  }
  if (local_e8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_e8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  local_e8.impl_.full_match_ = false;
  local_e8.impl_._17_7_ = 0;
  uStack_d0 = 0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::recursive_mutex_base::unlock(&local_90);
  }
  if (local_e8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_e8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  local_e8.impl_.full_match_ = false;
  local_e8.impl_._17_7_ = 0;
  uStack_d0 = 0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::recursive_mutex_base::unlock(&local_90);
  }
  if (local_e8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_e8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c8[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_e8,(testing *)local_c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a8,(PolymorphicMatcher *)&local_e8);
    if (local_e8.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.unlock()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0xc1,(DeathTest **)local_f8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    _Var6._M_head_impl = local_f8[0]._M_head_impl;
    if (!bVar3) goto LAB_00181dee;
    if (local_f8[0]._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00181e44;
    iVar4 = (**(code **)(*(long *)local_f8[0]._M_head_impl + 0x10))(local_f8[0]._M_head_impl);
    _Var2._M_head_impl = local_f8[0]._M_head_impl;
    if (iVar4 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_e8,6);
      iVar4 = (**(code **)(*(long *)&(local_f8[0]._M_head_impl)->field_0x0 + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_e8,iVar4);
      iVar4 = (**(code **)(*(long *)&(_Var2._M_head_impl)->field_0x0 + 0x20))
                        (_Var2._M_head_impl,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
        goto LAB_00181dee;
      }
    }
    else if (iVar4 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        yamc::checked::detail::recursive_mutex_base::unlock(&local_90);
      }
      (**(code **)(*(long *)&(local_f8[0]._M_head_impl)->field_0x0 + 0x28))
                (local_f8[0]._M_head_impl,2);
      (**(code **)(*(long *)&(_Var2._M_head_impl)->field_0x0 + 0x28))(_Var2._M_head_impl,0);
    }
    pcVar5 = *(char **)_Var6._M_head_impl;
  }
  else {
LAB_00181dee:
    testing::Message::Message((Message *)&local_e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xc1,pcVar5);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if (local_e8.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_00181e44;
    pcVar5 = (local_e8.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_e8.impl_.regex_.
         super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (**(code **)(pcVar5 + 8))(_Var6._M_head_impl);
LAB_00181e44:
  yamc::checked::recursive_mutex::~recursive_mutex((recursive_mutex *)&local_90);
  return;
}

Assistant:

TYPED_TEST(CheckedRecursiveMutexTest, InvalidUnlock2) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());    // lockcnt = 1
  ASSERT_NO_THROW(mtx.lock());    // lockcnt = 2
  ASSERT_NO_THROW(mtx.unlock());  // lockcnt = 1
  ASSERT_NO_THROW(mtx.unlock());  // lockcnt = 0
  EXPECT_CHECK_FAILURE(mtx.unlock());
}